

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void __thiscall despot::option::Option::Option(Option *this)

{
  Option *pOVar1;
  Option *this_local;
  
  this->desc = (Descriptor *)0x0;
  this->name = (char *)0x0;
  this->arg = (char *)0x0;
  this->namelen = 0;
  pOVar1 = tag(this);
  this->prev_ = pOVar1;
  pOVar1 = tag(this);
  this->next_ = pOVar1;
  return;
}

Assistant:

Option() :
		desc(0),
		name(0),
		arg(0),
		namelen(0) {
		prev_ = tag(this);
		next_ = tag(this);
	}